

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O0

uint32_t __thiscall
jrtplib::RTPPacketBuilder::CreateNewSSRC(RTPPacketBuilder *this,uint32_t initialTimestamp)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t initialTimestamp_local;
  RTPPacketBuilder *this_local;
  
  uVar1 = (*this->rtprnd->_vptr_RTPRandom[4])();
  this->ssrc = uVar1;
  if (initialTimestamp == 0) {
    uVar1 = (*this->rtprnd->_vptr_RTPRandom[4])();
    this->timestamp = uVar1;
  }
  else {
    this->timestamp = initialTimestamp;
  }
  iVar2 = (*this->rtprnd->_vptr_RTPRandom[3])();
  this->seqnr = (uint16_t)iVar2;
  this->numpayloadbytes = 0;
  this->numpackets = 0;
  return this->ssrc;
}

Assistant:

uint32_t RTPPacketBuilder::CreateNewSSRC(uint32_t initialTimestamp)
{
	ssrc = rtprnd.GetRandom32();
	if (initialTimestamp > 0)
		timestamp = initialTimestamp;
	else
		timestamp = rtprnd.GetRandom32();
	seqnr = rtprnd.GetRandom16();

	// p 38: the count SHOULD be reset if the sender changes its SSRC identifier
	numpayloadbytes = 0;
	numpackets = 0;
	return ssrc;
}